

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt_utils.h
# Opt level: O0

int is_winner_mode_processing_enabled
              (AV1_COMP *cpi,MACROBLOCK *x,MB_MODE_INFO *mbmi,int actual_txfm_skip)

{
  PREDICTION_MODE mode;
  int iVar1;
  int iVar2;
  MB_MODE_INFO *mbmi_00;
  int in_ECX;
  SPEED_FEATURES *in_RDX;
  MACROBLOCK *in_RSI;
  long in_RDI;
  PREDICTION_MODE best_mode;
  SPEED_FEATURES *sf;
  int in_stack_ffffffffffffffd8;
  int local_4;
  
  mbmi_00 = (MB_MODE_INFO *)(in_RDI + 0x608c0);
  mode = *(PREDICTION_MODE *)((long)&(in_RDX->hl_sf).frame_parameter_update + 2);
  iVar2 = bypass_winner_mode_processing
                    (in_RSI,in_RDX,in_ECX,in_stack_ffffffffffffffd8,
                     (PREDICTION_MODE)((ulong)mbmi_00 >> 0x38));
  if (iVar2 == 0) {
    iVar2 = is_inter_block(mbmi_00);
    if (iVar2 == 0) {
      iVar2._0_1_ = mbmi_00[4].cfl_alpha_signs;
      iVar2._1_1_ = mbmi_00[4].cfl_alpha_idx;
      iVar2._2_2_ = mbmi_00[4].palette_mode_info.palette_colors[0];
      if (((iVar2 != 0) && ((*(byte *)(in_RDI + 0x426f6) & 1) == 0)) &&
         ((*(byte *)(in_RDI + 0x426f4) & 1) == 0)) {
        return 1;
      }
    }
    else {
      iVar2 = is_inter_mode(mode);
      if (((iVar2 != 0) && (*(int *)(mbmi_00[4].palette_mode_info.palette_colors + 1) != 0x7fffffff)
          ) && ((*(byte *)(in_RDI + 0x426f5) & 1) == 0)) {
        return 1;
      }
    }
    iVar1._0_1_ = mbmi_00[5].bsize;
    iVar1._1_1_ = mbmi_00[5].partition;
    iVar1._2_1_ = mbmi_00[5].mode;
    iVar1._3_1_ = mbmi_00[5].uv_mode;
    if (((iVar1 == 0) ||
        (*(char *)(in_RDI + 0x427a0 +
                  (ulong)((byte)*(undefined2 *)
                                 ((long)&(in_RDX->part_sf).less_rectangular_check_level + 3) & 7))
         == '\0')) ||
       (*(char *)(in_RDI + 0x427a0 +
                 (ulong)((byte)*(undefined2 *)
                                ((long)&(in_RDX->part_sf).less_rectangular_check_level + 3) & 7)) ==
        '\x02')) {
      if (mbmi_00[5].current_qindex == 0) {
        local_4 = 0;
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static inline int is_winner_mode_processing_enabled(const struct AV1_COMP *cpi,
                                                    const MACROBLOCK *const x,
                                                    MB_MODE_INFO *const mbmi,
                                                    int actual_txfm_skip) {
  const SPEED_FEATURES *sf = &cpi->sf;
  const PREDICTION_MODE best_mode = mbmi->mode;

  if (bypass_winner_mode_processing(x, sf, mbmi->skip_txfm, actual_txfm_skip,
                                    best_mode))
    return 0;

  // TODO(any): Move block independent condition checks to frame level
  if (is_inter_block(mbmi)) {
    if (is_inter_mode(best_mode) &&
        (sf->tx_sf.tx_type_search.fast_inter_tx_type_prob_thresh != INT_MAX) &&
        !cpi->oxcf.txfm_cfg.use_inter_dct_only)
      return 1;
  } else {
    if (sf->tx_sf.tx_type_search.fast_intra_tx_type_search &&
        !cpi->oxcf.txfm_cfg.use_intra_default_tx_only &&
        !cpi->oxcf.txfm_cfg.use_intra_dct_only)
      return 1;
  }

  // Check speed feature related to winner mode processing
  if (sf->winner_mode_sf.enable_winner_mode_for_coeff_opt &&
      cpi->optimize_seg_arr[mbmi->segment_id] != NO_TRELLIS_OPT &&
      cpi->optimize_seg_arr[mbmi->segment_id] != FINAL_PASS_TRELLIS_OPT)
    return 1;
  if (sf->winner_mode_sf.enable_winner_mode_for_tx_size_srch) return 1;

  return 0;
}